

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

void __thiscall wasm::SExpressionWasmBuilder::parseData(SExpressionWasmBuilder *this,Element *s)

{
  bool bVar1;
  int iVar2;
  unkbyte9 Var3;
  bool bVar4;
  Element *pEVar5;
  Expression *init;
  undefined8 uVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  undefined1 isPassive;
  uint i;
  IString str;
  IString str_00;
  Name NVar7;
  Name name;
  char *local_58;
  string_view local_50;
  undefined4 local_3c;
  _Head_base<0UL,_wasm::DataSegment_*,_false> local_38;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> seg;
  SExpressionWasmBuilder *this_00;
  
  iVar2 = this->dataCounter;
  this->dataCounter = iVar2 + 1;
  local_50 = (string_view)Name::fromInt((long)iVar2);
  i = 1;
  pEVar5 = Element::operator[](s,1);
  if (pEVar5->isList_ == false) {
    i = 1;
    pEVar5 = Element::operator[](s,1);
    uVar6 = 0;
    local_3c = 0;
    if ((pEVar5->isList_ == false) && ((pEVar5->dollared_ & 1U) != 0)) {
      pEVar5 = Element::operator[](s,1);
      local_50 = (string_view)Element::str(pEVar5);
      i = 2;
      local_3c = (undefined4)CONCAT71((int7)((ulong)uVar6 >> 8),1);
    }
  }
  else {
    local_3c = 0;
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&this->dataSegmentNames,(value_type *)&local_50);
  pEVar5 = Element::operator[](s,i);
  bVar1 = pEVar5->isList_;
  isPassive = false;
  if (bVar1 == true) {
    pEVar5 = Element::operator[](s,i);
    str.str._M_str = extraout_RDX;
    str.str._M_len = MEMORY._8_8_;
    bVar4 = elementStartsWith(pEVar5,str);
    if (bVar4) {
      pEVar5 = Element::operator[](s,i);
      pEVar5 = Element::operator[](pEVar5,1);
      NVar7 = getMemoryName(this,pEVar5);
      Var3 = NVar7.super_IString.str._0_9_;
      i = i + 1;
    }
    else {
      NVar7 = getMemoryNameAtIdx(this,0);
      Var3 = NVar7.super_IString.str._0_9_;
    }
    local_58 = (char *)Var3;
    pEVar5 = Element::operator[](s,i);
    str_00.str._M_str = extraout_RDX_00;
    str_00.str._M_len = OFFSET._8_8_;
    bVar4 = elementStartsWith(pEVar5,str_00);
    if (bVar4) {
      pEVar5 = Element::operator[](pEVar5,1);
    }
    i = i + 1;
    init = parseExpression(this,pEVar5);
    isPassive = (undefined1)((unkuint9)Var3 >> 0x40);
  }
  else {
    local_58 = (char *)0x0;
    init = (Expression *)0x0;
  }
  NVar7.super_IString.str._M_str = local_58;
  NVar7.super_IString.str._M_len = (size_t)local_50._M_str;
  name.super_IString.str._M_str = (char *)local_50._M_len;
  name.super_IString.str._M_len = (size_t)&stack0xffffffffffffffc8;
  this_00 = (SExpressionWasmBuilder *)&stack0xffffffffffffffc8;
  Builder::makeDataSegment
            (name,NVar7,(bool)isPassive,(Expression *)(ulong)(bVar1 ^ 1),(char *)init,
             (Address)0xc12c44);
  *(char *)((long)local_38._M_head_impl + 0x10) = (char)local_3c;
  parseInnerData(this_00,s,i,
                 (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                 &stack0xffffffffffffffc8);
  Module::addDataSegment
            (this->wasm,
             (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
             &stack0xffffffffffffffc8);
  std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
            ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
             &stack0xffffffffffffffc8);
  return;
}

Assistant:

void SExpressionWasmBuilder::parseData(Element& s) {
  Index i = 1;
  Name name = Name::fromInt(dataCounter++);
  bool hasExplicitName = false;
  Name memory;
  bool isPassive = true;
  Expression* offset = nullptr;

  if (s[i]->isStr() && s[i]->dollared()) {
    name = s[i++]->str();
    hasExplicitName = true;
  }
  dataSegmentNames.push_back(name);

  if (s[i]->isList()) {
    // Optional (memory <memoryidx>)
    if (elementStartsWith(s[i], MEMORY)) {
      auto& inner = *s[i++];
      memory = getMemoryName(*inner[1]);
    } else {
      memory = getMemoryNameAtIdx(0);
    }
    // Offset expression (offset (<expr>)) | (<expr>)
    auto& inner = *s[i++];
    if (elementStartsWith(inner, OFFSET)) {
      offset = parseExpression(inner[1]);
    } else {
      offset = parseExpression(inner);
    }
    isPassive = false;
  }

  auto seg = Builder::makeDataSegment(name, memory, isPassive, offset);
  seg->hasExplicitName = hasExplicitName;
  parseInnerData(s, i, seg);
  wasm.addDataSegment(std::move(seg));
}